

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_229b2::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  DeepImageChannel *pDVar1;
  ImageLevel *pIVar2;
  _func_int **pp_Var3;
  bool bVar4;
  double dVar5;
  short sVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  iterator iVar10;
  Iterator IVar11;
  ostream *poVar12;
  ImageChannel *pIVar13;
  DeepImageLevel *pDVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  float i;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"             sample counts ",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  iVar16 = (level->_sampleCounts).super_ImageChannel._pixelsPerColumn *
           (level->_sampleCounts).super_ImageChannel._pixelsPerRow;
  puVar8 = Imf_2_5::SampleCountChannel::beginEdit(&level->_sampleCounts);
  if (iVar16 != 0) {
    lVar17 = 0;
    do {
      lVar9 = Imath_2_5::nrand48(random->_state);
      puVar8[lVar17] =
           (int)lVar9 +
           ((int)(SUB168(SEXT816(lVar9) * SEXT816(0x6666666666666667),8) >> 2) -
           (SUB164(SEXT816(lVar9) * SEXT816(0x6666666666666667),0xc) >> 0x1f)) * -10;
      lVar17 = lVar17 + 1;
    } while (iVar16 != lVar17);
  }
  Imf_2_5::SampleCountChannel::endEdit(&level->_sampleCounts);
  iVar10._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level);
  do {
    IVar11 = Imf_2_5::DeepImageLevel::end(level);
    if ((iterator)iVar10._M_node == IVar11._i._M_node) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"             channel ",0x15);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(iVar10._M_node + 1),
                         (long)iVar10._M_node[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    iVar16 = (**(code **)**(undefined8 **)(iVar10._M_node + 2))();
    if (iVar16 == 0) {
      pDVar1 = *(DeepImageChannel **)(iVar10._M_node + 2);
      pIVar13 = (ImageChannel *)
                __dynamic_cast(pDVar1,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
      if (pIVar13 == (ImageChannel *)0x0) goto LAB_0011bf96;
      pIVar2 = pIVar13->_level;
      pDVar14 = Imf_2_5::DeepImageChannel::deepLevel(pDVar1);
      iVar16 = (pIVar2->_dataWindow).min.y;
      iVar7 = (pIVar2->_dataWindow).max.y;
      if (iVar16 <= iVar7) {
        iVar15 = (pIVar2->_dataWindow).max.x;
        do {
          iVar18 = (pIVar2->_dataWindow).min.x;
          if (iVar18 <= iVar15) {
            do {
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar14->_sampleCounts).super_ImageChannel,iVar18,iVar16);
              lVar17 = (long)(int)(pDVar14->_sampleCounts)._base
                                  [(pDVar14->_sampleCounts).super_ImageChannel._pixelsPerRow *
                                   iVar16 + iVar18];
              Imf_2_5::ImageChannel::boundsCheck(pIVar13,iVar18,iVar16);
              if (0 < lVar17) {
                pp_Var3 = (&(pIVar13[1]._level)->_vptr_ImageLevel)
                          [pIVar13->_pixelsPerRow * iVar16 + iVar18];
                lVar9 = 0;
                do {
                  dVar5 = Imath_2_5::erand48(random->_state);
                  *(int *)((long)pp_Var3 + lVar9 * 4) =
                       (int)(long)((1.0 - dVar5) * 0.0 + dVar5 * 100.0);
                  lVar9 = lVar9 + 1;
                } while (lVar17 != lVar9);
              }
              iVar15 = (pIVar2->_dataWindow).max.x;
              bVar4 = iVar18 < iVar15;
              iVar18 = iVar18 + 1;
            } while (bVar4);
            iVar7 = (pIVar2->_dataWindow).max.y;
          }
          bVar4 = iVar16 < iVar7;
          iVar16 = iVar16 + 1;
        } while (bVar4);
      }
    }
    else if (iVar16 == 2) {
      pDVar1 = *(DeepImageChannel **)(iVar10._M_node + 2);
      pIVar13 = (ImageChannel *)
                __dynamic_cast(pDVar1,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0);
      if (pIVar13 == (ImageChannel *)0x0) goto LAB_0011bf96;
      pIVar2 = pIVar13->_level;
      pDVar14 = Imf_2_5::DeepImageChannel::deepLevel(pDVar1);
      iVar16 = (pIVar2->_dataWindow).min.y;
      iVar7 = (pIVar2->_dataWindow).max.y;
      if (iVar16 <= iVar7) {
        iVar15 = (pIVar2->_dataWindow).max.x;
        do {
          iVar18 = (pIVar2->_dataWindow).min.x;
          if (iVar18 <= iVar15) {
            do {
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar14->_sampleCounts).super_ImageChannel,iVar18,iVar16);
              lVar17 = (long)(int)(pDVar14->_sampleCounts)._base
                                  [(pDVar14->_sampleCounts).super_ImageChannel._pixelsPerRow *
                                   iVar16 + iVar18];
              Imf_2_5::ImageChannel::boundsCheck(pIVar13,iVar18,iVar16);
              if (0 < lVar17) {
                pp_Var3 = (&(pIVar13[1]._level)->_vptr_ImageLevel)
                          [pIVar13->_pixelsPerRow * iVar16 + iVar18];
                lVar9 = 0;
                do {
                  dVar5 = Imath_2_5::erand48(random->_state);
                  *(float *)((long)pp_Var3 + lVar9 * 4) =
                       (float)((1.0 - dVar5) * 0.0 + dVar5 * 100.0);
                  lVar9 = lVar9 + 1;
                } while (lVar17 != lVar9);
              }
              iVar15 = (pIVar2->_dataWindow).max.x;
              bVar4 = iVar18 < iVar15;
              iVar18 = iVar18 + 1;
            } while (bVar4);
            iVar7 = (pIVar2->_dataWindow).max.y;
          }
          bVar4 = iVar16 < iVar7;
          iVar16 = iVar16 + 1;
        } while (bVar4);
      }
    }
    else {
      if (iVar16 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                      ,0x129,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)")
        ;
      }
      pDVar1 = *(DeepImageChannel **)(iVar10._M_node + 2);
      pIVar13 = (ImageChannel *)
                __dynamic_cast(pDVar1,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
      if (pIVar13 == (ImageChannel *)0x0) {
LAB_0011bf96:
        __cxa_bad_cast();
      }
      pIVar2 = pIVar13->_level;
      pDVar14 = Imf_2_5::DeepImageChannel::deepLevel(pDVar1);
      iVar16 = (pIVar2->_dataWindow).min.y;
      iVar7 = (pIVar2->_dataWindow).max.y;
      if (iVar16 <= iVar7) {
        iVar15 = (pIVar2->_dataWindow).max.x;
        do {
          iVar18 = (pIVar2->_dataWindow).min.x;
          if (iVar18 <= iVar15) {
            do {
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar14->_sampleCounts).super_ImageChannel,iVar18,iVar16);
              lVar17 = (long)(int)(pDVar14->_sampleCounts)._base
                                  [(pDVar14->_sampleCounts).super_ImageChannel._pixelsPerRow *
                                   iVar16 + iVar18];
              Imf_2_5::ImageChannel::boundsCheck(pIVar13,iVar18,iVar16);
              if (0 < lVar17) {
                pp_Var3 = (&(pIVar13[1]._level)->_vptr_ImageLevel)
                          [pIVar13->_pixelsPerRow * iVar16 + iVar18];
                lVar9 = 0;
                do {
                  dVar5 = Imath_2_5::erand48(random->_state);
                  i = (float)((1.0 - dVar5) * 0.0 + dVar5 * 100.0);
                  if ((i != 0.0) || (NAN(i))) {
                    if (half::_eLut[(uint)i >> 0x17] == 0) {
                      sVar6 = half::convert((int)i);
                    }
                    else {
                      sVar6 = half::_eLut[(uint)i >> 0x17] +
                              (short)(((uint)i & 0x7fffff) + 0xfff +
                                      (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  else {
                    sVar6 = (short)((uint)i >> 0x10);
                  }
                  *(short *)((long)pp_Var3 + lVar9 * 2) = sVar6;
                  lVar9 = lVar9 + 1;
                } while (lVar17 != lVar9);
              }
              iVar15 = (pIVar2->_dataWindow).max.x;
              bVar4 = iVar18 < iVar15;
              iVar18 = iVar18 + 1;
            } while (bVar4);
            iVar7 = (pIVar2->_dataWindow).max.y;
          }
          bVar4 = iVar16 < iVar7;
          iVar16 = iVar16 + 1;
        } while (bVar4);
      }
    }
    iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node);
  } while( true );
}

Assistant:

void
fillChannels (Rand48 &random, DeepImageLevel &level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts());

    for (DeepImageLevel::Iterator i = level.begin(); i != level.end(); ++i)
    {
        cout << "             channel " << i.name() << endl;

        switch (i.channel().pixelType())
        {
          case HALF:
            fillChannel <half> (random, i.channel());
            break;

          case FLOAT:
            fillChannel <float> (random, i.channel());
            break;

          case UINT:
            fillChannel <unsigned int> (random, i.channel());
            break;

          default:
             assert (false);
        }
    }
}